

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O1

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::~SPxBasisBase(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  Status *pSVar1;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **__ptr;
  SPxId *__ptr_00;
  
  this->_vptr_SPxBasisBase = (_func_int **)&PTR_change_006b3800;
  if (this->freeSlinSolver == true) {
    if (this->factor !=
        (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      (*this->factor->_vptr_SLinSolver[0x1c])();
    }
    this->factor = (SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0;
  }
  (**this->theTime->_vptr_Timer)();
  free(this->theTime);
  this->theTime = (Timer *)0x0;
  pSVar1 = (this->thedesc).colstat.data;
  if (pSVar1 != (Status *)0x0) {
    free(pSVar1);
    (this->thedesc).colstat.data = (Status *)0x0;
  }
  pSVar1 = (this->thedesc).rowstat.data;
  if (pSVar1 != (Status *)0x0) {
    free(pSVar1);
    (this->thedesc).rowstat.data = (Status *)0x0;
  }
  __ptr = (this->matrix).data;
  if (__ptr != (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                **)0x0) {
    free(__ptr);
    (this->matrix).data =
         (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          **)0x0;
  }
  __ptr_00 = (this->theBaseId).data;
  if (__ptr_00 != (SPxId *)0x0) {
    free(__ptr_00);
    (this->theBaseId).data = (SPxId *)0x0;
  }
  return;
}

Assistant:

SPxBasisBase<R>::~SPxBasisBase()
{

   assert(!freeSlinSolver || factor != nullptr);

   if(freeSlinSolver)
   {
      delete factor;
      factor = nullptr;
   }

   theTime->~Timer();
   spx_free(theTime);
}